

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall
Omega_h::Write<double>::Write(Write<double> *this,LO size_in,double value,string *name_in)

{
  Write<double> local_38;
  string *local_28;
  string *name_in_local;
  double value_local;
  Write<double> *pWStack_10;
  LO size_in_local;
  Write<double> *this_local;
  
  local_28 = name_in;
  name_in_local = (string *)value;
  value_local._4_4_ = size_in;
  pWStack_10 = this;
  Write(this,size_in,name_in);
  Write(&local_38,this);
  fill<double>(&local_38,(double)name_in_local);
  ~Write(&local_38);
  return;
}

Assistant:

Write<T>::Write(LO size_in, T value, std::string const& name_in)
    : Write<T>(size_in, name_in) {
  fill(*this, value);
}